

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

void __thiscall leveldb::RecoveryTest::DeleteManifestFile(RecoveryTest *this)

{
  Env *pEVar1;
  undefined1 local_1d8 [456];
  RecoveryTest *local_10;
  RecoveryTest *this_local;
  
  local_10 = this;
  test::Tester::Tester
            ((Tester *)(local_1d8 + 0x28),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x6c);
  pEVar1 = this->env_;
  ManifestFileName_abi_cxx11_((RecoveryTest *)local_1d8);
  (*pEVar1->_vptr_Env[8])(local_1d8 + 0x20,pEVar1,local_1d8);
  test::Tester::IsOk((Tester *)(local_1d8 + 0x28),(Status *)(local_1d8 + 0x20));
  Status::~Status((Status *)(local_1d8 + 0x20));
  std::__cxx11::string::~string((string *)local_1d8);
  test::Tester::~Tester((Tester *)(local_1d8 + 0x28));
  return;
}

Assistant:

void DeleteManifestFile() { ASSERT_OK(env_->DeleteFile(ManifestFileName())); }